

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<int> __thiscall wasm::WATParser::Lexer::takeS<int>(Lexer *this)

{
  bool bVar1;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    bVar1 = ((ulong)result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                    ._M_payload._M_value.super_LexResult.span._M_str & 0xffffffff80000000) == 0;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ == 2) {
      bVar1 = result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str + 0x80000000 < (char *)0x80000001;
    }
    if (bVar1) {
      this->pos = this->pos + (long)local_40;
      advance(this);
      return (_Optional_base<int,_true,_true>)
             (_Optional_base<int,_true,_true>)
             ((ulong)result.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                     ._M_payload._M_value.super_LexResult.span._M_str & 0xffffffff | 0x100000000);
    }
  }
  return (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
}

Assistant:

std::optional<T> Lexer::takeS() {
  static_assert(std::is_integral_v<T> && std::is_signed_v<T>);
  if (auto result = integer(next()); result && result->isSigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  return std::nullopt;
}